

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shell.cpp
# Opt level: O3

bool anon_unknown.dwarf_69c8::prefixed(string_view command,string_view prefix,string_view *suffix)

{
  bool bVar1;
  int iVar2;
  ulong __n;
  string_view sVar3;
  string_view local_20;
  
  __n = prefix._len;
  local_20._len = command._len;
  local_20._ptr = command._ptr;
  if (local_20._len < __n) {
LAB_0010287f:
    bVar1 = false;
  }
  else {
    if (__n != 0) {
      iVar2 = bcmp(local_20._ptr,prefix._ptr,__n);
      if (iVar2 != 0) goto LAB_0010287f;
    }
    sVar3 = mserialize::string_view::substr(&local_20,__n,0xffffffffffffffff);
    *suffix = sVar3;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool prefixed(mserialize::string_view command, mserialize::string_view prefix, mserialize::string_view& suffix)
{
  if (! command.starts_with(prefix)) { return false; }

  suffix = command.substr(prefix.size());
  return true;
}